

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemListView.cpp
# Opt level: O1

void __thiscall QFileSystemListView::QFileSystemListView(QFileSystemListView *this,QWidget *parent)

{
  QFileSystemListViewPrivate *this_00;
  QArrayDataPointer<char16_t> local_30;
  
  QListView::QListView(&this->super_QListView,parent);
  *(undefined ***)this = &PTR_metaObject_001a9fc8;
  *(undefined ***)&this->field_0x10 = &PTR__QFileSystemListView_001aa2d8;
  this_00 = (QFileSystemListViewPrivate *)operator_new(0x28);
  QFileSystemListViewPrivate::QFileSystemListViewPrivate(this_00,this);
  this->d = this_00;
  QListView::setUniformItemSizes(SUB81(this,0));
  QAbstractItemView::setModel((QAbstractItemModel *)this);
  QDir::homePath();
  setRootPath(this,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  return;
}

Assistant:

QFileSystemListView::QFileSystemListView(QWidget *parent)
    : QListView(parent)
    , d(new QFileSystemListViewPrivate(this)) {
    setUniformItemSizes(true);
    QListView::setModel(d->model);
    setRootPath(QDir::homePath());
}